

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
serializer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
::serializer(serializer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
             *this,output_adapter_t<char> *s,char ichar,error_handler_t error_handler_)

{
  char cVar1;
  lconv *plVar2;
  char_type local_61;
  char_type local_51;
  allocator local_29;
  int local_28;
  int local_24;
  error_handler_t local_20;
  char local_19;
  error_handler_t error_handler__local;
  char ichar_local;
  output_adapter_t<char> *s_local;
  serializer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *this_local;
  
  local_20 = error_handler_;
  local_19 = ichar;
  _error_handler__local = s;
  s_local = &this->o;
  std::shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>_>::shared_ptr
            (&this->o,s);
  memset(&this->number_buffer,0,0x40);
  plVar2 = localeconv();
  this->loc = (lconv *)plVar2;
  if (this->loc->thousands_sep == (char *)0x0) {
    local_51 = '\0';
  }
  else {
    local_24 = (int)*this->loc->thousands_sep;
    local_51 = std::char_traits<char>::to_char_type(&local_24);
  }
  this->thousands_sep = local_51;
  if (this->loc->decimal_point == (char *)0x0) {
    local_61 = '\0';
  }
  else {
    local_28 = (int)*this->loc->decimal_point;
    local_61 = std::char_traits<char>::to_char_type(&local_28);
  }
  this->decimal_point = local_61;
  memset(&this->string_buffer,0,0x200);
  this->indent_char = local_19;
  cVar1 = this->indent_char;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->indent_string,0x200,cVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  this->error_handler = local_20;
  return;
}

Assistant:

serializer(output_adapter_t<char> s, const char ichar,
               error_handler_t error_handler_ = error_handler_t::strict)
        : o(std::move(s))
        , loc(std::localeconv())
        , thousands_sep(loc->thousands_sep == nullptr ? '\0' : std::char_traits<char>::to_char_type(* (loc->thousands_sep)))
        , decimal_point(loc->decimal_point == nullptr ? '\0' : std::char_traits<char>::to_char_type(* (loc->decimal_point)))
        , indent_char(ichar)
        , indent_string(512, indent_char)
        , error_handler(error_handler_)
    {}